

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O1

bool __thiscall QSslKey::operator==(QSslKey *this,QSslKey *other)

{
  _Head_base<0UL,_QTlsPrivate::TlsKey_*,_false> _Var1;
  _Head_base<0UL,_QTlsPrivate::TlsKey_*,_false> _Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar7;
  long lVar8;
  TlsKey *tlsKey;
  long in_FS_OFFSET;
  byte bVar9;
  QByteArray local_98;
  QByteArray local_80;
  QByteArray local_68;
  QByteArray local_48;
  long local_30;
  QSslKeyPrivate *pQVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (this->d).d.ptr;
  _Var1._M_head_impl =
       *(TlsKey **)
        &(pQVar6->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>;
  if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
      (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
    uVar3 = (*(_Var1._M_head_impl)->_vptr_TlsKey[9])(_Var1._M_head_impl);
    pQVar6 = (QSslKeyPrivate *)(ulong)uVar3;
  }
  bVar9 = (byte)pQVar6;
  _Var2._M_head_impl =
       *(TlsKey **)
        &(((other->d).d.ptr)->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>;
  if ((_Var1._M_head_impl == (TlsKey *)0x0) || (((ulong)pQVar6 & 1) != 0)) {
    _Var1._M_head_impl = _Var2._M_head_impl;
    if (_Var2._M_head_impl != (TlsKey *)0x0) {
      iVar4 = (*(_Var2._M_head_impl)->_vptr_TlsKey[9])(_Var2._M_head_impl);
      bVar9 = (byte)iVar4;
    }
  }
  else {
    if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var2._M_head_impl !=
        (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
      uVar3 = (*(_Var2._M_head_impl)->_vptr_TlsKey[9])(_Var2._M_head_impl);
      pQVar6 = (QSslKeyPrivate *)(ulong)uVar3;
    }
    bVar9 = (byte)pQVar6;
    _Var1._M_head_impl =
         *(TlsKey **)
          &(((this->d).d.ptr)->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>.
           _M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>;
    if ((_Var2._M_head_impl != (TlsKey *)0x0) && (((ulong)pQVar6 & 1) == 0)) {
      iVar5 = 0;
      iVar4 = 0;
      if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
          (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
        iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[0xb])(_Var1._M_head_impl);
      }
      _Var1._M_head_impl =
           *(TlsKey **)
            &(((other->d).d.ptr)->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>.
             _M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
      ;
      if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
          (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
        iVar5 = (*(_Var1._M_head_impl)->_vptr_TlsKey[0xb])();
      }
      if (iVar4 == iVar5) {
        _Var1._M_head_impl =
             *(TlsKey **)
              &(((this->d).d.ptr)->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
        ;
        iVar5 = 1;
        iVar4 = 1;
        if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
            (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
          iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[10])();
        }
        _Var1._M_head_impl =
             *(TlsKey **)
              &(((other->d).d.ptr)->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
        ;
        if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
            (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
          iVar5 = (*(_Var1._M_head_impl)->_vptr_TlsKey[10])();
        }
        if (iVar4 == iVar5) {
          _Var1._M_head_impl =
               *(TlsKey **)
                &(((this->d).d.ptr)->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
          ;
          iVar5 = -1;
          iVar4 = -1;
          if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
              (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
            iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[0xc])();
          }
          _Var1._M_head_impl =
               *(TlsKey **)
                &(((other->d).d.ptr)->backend)._M_t.
                 super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
          ;
          if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
              (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
            iVar5 = (*(_Var1._M_head_impl)->_vptr_TlsKey[0xc])();
          }
          if (iVar4 == iVar5) {
            _Var1._M_head_impl =
                 *(TlsKey **)
                  &(((this->d).d.ptr)->backend)._M_t.
                   super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
            ;
            if (((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl ==
                 (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) ||
               (iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[0xb])(), iVar4 == 0)) {
              _Var1._M_head_impl =
                   *(TlsKey **)
                    &(((this->d).d.ptr)->backend)._M_t.
                     super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
              ;
              if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl ==
                  (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
                lVar7 = 0;
              }
              else {
                iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[8])();
                lVar7 = CONCAT44(extraout_var,iVar4);
              }
              _Var1._M_head_impl =
                   *(TlsKey **)
                    &(((other->d).d.ptr)->backend)._M_t.
                     super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>
              ;
              if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl ==
                  (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
                lVar8 = 0;
              }
              else {
                iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[8])();
                lVar8 = CONCAT44(extraout_var_00,iVar4);
              }
              bVar9 = lVar7 == lVar8;
            }
            else {
              bVar9 = false;
              local_68.d.size = 0;
              local_68.d.d = (Data *)0x0;
              local_68.d.ptr = (char *)0x0;
              toDer(&local_48,this,&local_68);
              local_98.d.size = 0;
              local_98.d.d = (Data *)0x0;
              local_98.d.ptr = (char *)0x0;
              toDer(&local_80,other,&local_98);
              if (local_48.d.size == local_80.d.size) {
                if (local_48.d.size == 0) {
                  bVar9 = true;
                }
                else {
                  iVar4 = bcmp(local_48.d.ptr,local_80.d.ptr,local_48.d.size);
                  bVar9 = iVar4 == 0;
                }
              }
              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
                }
              }
            }
            goto LAB_0024f667;
          }
        }
      }
      bVar9 = 0;
      goto LAB_0024f667;
    }
    if (_Var1._M_head_impl != (TlsKey *)0x0) {
      iVar4 = (*(_Var1._M_head_impl)->_vptr_TlsKey[9])(_Var1._M_head_impl);
      bVar9 = (byte)iVar4;
    }
  }
  bVar9 = _Var1._M_head_impl == (TlsKey *)0x0 | bVar9;
LAB_0024f667:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool QSslKey::operator==(const QSslKey &other) const
{
    if (isNull())
        return other.isNull();
    if (other.isNull())
        return isNull();
    if (algorithm() != other.algorithm())
        return false;
    if (type() != other.type())
        return false;
    if (length() != other.length())
        return false;
    if (algorithm() == QSsl::Opaque)
        return handle() == other.handle();
    return toDer() == other.toDer();
}